

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Gia_Man_t *
Gia_PolynCoreDupTree
          (Gia_Man_t *p,Vec_Int_t *vAddCos,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,int fAddCones)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                  ,0x15d,
                  "Gia_Man_t *Gia_PolynCoreDupTree(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  if (fAddCones == 0) {
    for (iVar5 = 0; iVar5 < vLeaves->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(vLeaves,iVar5);
      pGVar4 = Gia_ManObj(p,iVar1);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGVar4->Value = uVar2;
    }
  }
  else {
    for (iVar5 = 0; iVar5 < p->vCis->nSize - p->nRegs; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(p->vCis,iVar5);
      pGVar4 = Gia_ManObj(p,iVar1);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGVar4->Value = uVar2;
    }
    for (iVar5 = 0; iVar5 < vLeaves->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(vLeaves,iVar5);
      pGVar4 = Gia_ManObj(p,iVar1);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar2 = Gia_PolynCoreDupTreePlus_rec(p_00,p,pGVar4);
      pGVar4->Value = uVar2;
    }
  }
  for (iVar5 = 0; iVar5 < vNodes->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    iLit1 = Gia_ObjFanin1Copy(pGVar4);
    uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
    pGVar4->Value = uVar2;
  }
  iVar5 = 0;
  while ((iVar5 < p->vCos->nSize && (pGVar4 = Gia_ManCo(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_00,iVar1);
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while( true ) {
    if (vAddCos->nSize <= iVar5) {
      return p_00;
    }
    iVar1 = Vec_IntEntry(vAddCos,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManAppendCo(p_00,pGVar4->Value);
    iVar5 = iVar5 + 1;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDupTree( Gia_Man_t * p, Vec_Int_t * vAddCos, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, int fAddCones )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( fAddCones )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_PolynCoreDupTreePlus_rec( pNew, p, pObj );
    }
    else
    {
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vAddCos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    return pNew;

}